

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O0

int scestat(char *path,SceIoStat *sce)

{
  int iVar1;
  __uint32_t _Var2;
  __uint64_t _Var3;
  undefined1 local_b0 [8];
  stat st;
  SceIoStat *sce_local;
  char *path_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)sce;
  iVar1 = stat(path,(stat *)local_b0);
  if (iVar1 < 0) {
    path_local._4_4_ = -1;
  }
  else {
    *(undefined4 *)st.__glibc_reserved[2] = 0;
    if (((uint)st.st_nlink & 0xf000) == 0x4000) {
      *(uint *)st.__glibc_reserved[2] = *(uint *)st.__glibc_reserved[2] | 0x1000;
    }
    else {
      *(uint *)st.__glibc_reserved[2] = *(uint *)st.__glibc_reserved[2] | 0x2000;
    }
    if (((uint)st.st_nlink & 0x100) == 0x100) {
      *(uint *)st.__glibc_reserved[2] = *(uint *)st.__glibc_reserved[2] | 4;
    }
    if (((uint)st.st_nlink & 0x80) == 0x80) {
      *(uint *)st.__glibc_reserved[2] = *(uint *)st.__glibc_reserved[2] | 2;
    }
    if (((uint)st.st_nlink & 0x20) == 0x20) {
      *(uint *)st.__glibc_reserved[2] = *(uint *)st.__glibc_reserved[2] | 0x20;
    }
    if (((uint)st.st_nlink & 0x10) == 0x10) {
      *(uint *)st.__glibc_reserved[2] = *(uint *)st.__glibc_reserved[2] | 0x10;
    }
    if (((uint)st.st_nlink & 4) == 4) {
      *(uint *)st.__glibc_reserved[2] = *(uint *)st.__glibc_reserved[2] | 0x100;
    }
    if (((uint)st.st_nlink & 2) == 2) {
      *(uint *)st.__glibc_reserved[2] = *(uint *)st.__glibc_reserved[2] | 0x80;
    }
    _Var2 = __uint32_identity(*(__uint32_t *)st.__glibc_reserved[2]);
    *(__uint32_t *)st.__glibc_reserved[2] = _Var2;
    _Var2 = __uint32_identity(0);
    *(__uint32_t *)(st.__glibc_reserved[2] + 4) = _Var2;
    _Var3 = __uint64_identity(st.st_rdev);
    *(__uint64_t *)(st.__glibc_reserved[2] + 8) = _Var3;
    time_to_scetime(&st.st_mtim.tv_nsec,(SceDateTime *)(st.__glibc_reserved[2] + 0x10));
    time_to_scetime(&st.st_blocks,(SceDateTime *)(st.__glibc_reserved[2] + 0x20));
    time_to_scetime(&st.st_atim.tv_nsec,(SceDateTime *)(st.__glibc_reserved[2] + 0x30));
    memset((void *)(st.__glibc_reserved[2] + 0x40),0,0x18);
    path_local._4_4_ = 0;
  }
  return path_local._4_4_;
}

Assistant:

static int scestat(const char *path, SceIoStat *sce) {
  struct stat st;

  if (stat(path, &st) < 0) {
    return -1;
  }

  sce->sst_mode = 0;
  if (S_ISDIR(st.st_mode)) {
    sce->sst_mode |= SCE_S_IFDIR;
  } else {
    sce->sst_mode |= SCE_S_IFREG;
  }
  if ((st.st_mode & S_IRUSR) == S_IRUSR) {
    sce->sst_mode |= SCE_S_IRUSR;
  }
  if ((st.st_mode & S_IWUSR) == S_IWUSR) {
    sce->sst_mode |= SCE_S_IWUSR;
  }
  if ((st.st_mode & S_IRGRP) == S_IRGRP) {
    sce->sst_mode |= SCE_S_IRGRP;
  }
  if ((st.st_mode & S_IWGRP) == S_IWGRP) {
    sce->sst_mode |= SCE_S_IWGRP;
  }
  if ((st.st_mode & S_IROTH) == S_IROTH) {
    sce->sst_mode |= SCE_S_IROTH;
  }
  if ((st.st_mode & S_IWOTH) == S_IWOTH) {
    sce->sst_mode |= SCE_S_IWOTH;
  }
  sce->sst_mode = htole32(sce->sst_mode);
  sce->sst_attr = htole32(0);
  sce->sst_size = htole64(st.st_size);
  time_to_scetime(&st.st_ctime, &sce->sst_ctime);
  time_to_scetime(&st.st_atime, &sce->sst_atime);
  time_to_scetime(&st.st_mtime, &sce->sst_mtime);
  memset(sce->sst_private, 0, sizeof(sce->sst_private));

  return 0;
}